

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall
embree::sse2::SubdivMeshISA::interpolate(SubdivMeshISA *this,RTCInterpolateArguments *args)

{
  long lVar1;
  float u;
  float v;
  uint uVar2;
  uint uVar3;
  RawBufferView *pRVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  char *pcVar11;
  uint uVar12;
  vfloat_impl<4> *dPdv;
  vfloat_impl<4> *ddPdudu;
  vfloat_impl<4> *ddPdvdv;
  vfloat_impl<4> *ddPdudv;
  ulong uVar13;
  ulong stride;
  vfloat_impl<4> *P;
  vfloat_impl<4> *dPdu;
  vfloat4 *pvVar14;
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  *pvVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  Topology *pTVar19;
  pointer pvVar20;
  bool bVar21;
  vfloat4 ddPdudvt;
  vfloat4 ddPdvdvt;
  vfloat4 ddPdudut;
  vfloat4 dPdvt;
  vfloat4 dPdut;
  vfloat4 Pt;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_60;
  
  uVar16 = args->bufferSlot;
  uVar2 = args->valueCount;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pRVar4 = (this->super_SubdivMesh).vertexAttribs.items;
    pvVar15 = &(this->super_SubdivMesh).vertex_attrib_buffer_tags;
    pTVar19 = (this->super_SubdivMesh).topology.items + pRVar4[uVar16].userData;
  }
  else {
    pRVar4 = &((this->super_SubdivMesh).vertices.items)->super_RawBufferView;
    pvVar15 = &(this->super_SubdivMesh).vertex_buffer_tags;
    pTVar19 = (this->super_SubdivMesh).topology.items;
  }
  if (uVar2 != 0) {
    uVar3 = args->primID;
    u = args->u;
    v = args->v;
    pfVar5 = args->P;
    pfVar6 = args->dPdu;
    pfVar7 = args->dPdv;
    pfVar8 = args->ddPdudu;
    pfVar9 = args->ddPdvdv;
    pfVar10 = args->ddPdudv;
    pvVar20 = (pvVar15->
              super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar16;
    stride = (ulong)(uint)pRVar4[uVar16].stride;
    P = &Pt;
    if (pfVar5 == (float *)0x0) {
      P = (vfloat_impl<4> *)0x0;
    }
    dPdu = &dPdut;
    if (pfVar6 == (float *)0x0) {
      dPdu = (vfloat_impl<4> *)0x0;
    }
    pcVar11 = pRVar4[uVar16].ptr_ofs;
    dPdv = &dPdvt;
    if (pfVar6 == (float *)0x0) {
      dPdv = (vfloat_impl<4> *)0x0;
    }
    bVar21 = pfVar8 == (float *)0x0;
    ddPdudu = &ddPdudut;
    if (bVar21) {
      ddPdudu = (vfloat_impl<4> *)0x0;
    }
    ddPdvdv = &ddPdvdvt;
    if (bVar21) {
      ddPdvdv = (vfloat_impl<4> *)0x0;
    }
    ddPdudv = &ddPdudvt;
    if (bVar21) {
      ddPdudv = (vfloat_impl<4> *)0x0;
    }
    uVar16 = 0;
    do {
      uVar13 = (ulong)(uVar16 >> 2) + (stride + 0xf >> 4) * (ulong)uVar3;
      lVar18 = *(long *)&(pvVar20->
                         super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                         )._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&(pvVar20->
                                 super__Vector_base<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                                 )._M_impl.super__Vector_impl_data + 8) - lVar18 >> 4) <= uVar13) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar13);
      }
      uVar17 = (ulong)uVar16;
      PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::PatchEval
                (&local_60,(CacheEntry *)(lVar18 + uVar13 * 0x10),
                 (this->super_SubdivMesh).commitCounter,
                 (pTVar19->halfEdges).items + (pTVar19->mesh->faceStartEdge).items[uVar3],
                 pcVar11 + uVar17 * 4,stride,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
      if (pfVar5 != (float *)0x0) {
        uVar12 = uVar16 + 4;
        if (uVar2 <= uVar16 + 4) {
          uVar12 = uVar2;
        }
        if (uVar16 < uVar12) {
          pvVar14 = &Pt;
          uVar13 = uVar17;
          do {
            pfVar5[uVar13] = (pvVar14->field_0).v[0];
            uVar13 = uVar13 + 1;
            pvVar14 = (vfloat4 *)((long)&pvVar14->field_0 + 4);
          } while (uVar13 < uVar12);
        }
      }
      if (pfVar6 != (float *)0x0) {
        uVar12 = uVar16 + 4;
        if (uVar2 <= uVar16 + 4) {
          uVar12 = uVar2;
        }
        if (uVar16 < uVar12) {
          lVar18 = 0;
          do {
            pfVar6[uVar17 + lVar18] = dPdut.field_0.v[lVar18];
            pfVar7[uVar17 + lVar18] = dPdvt.field_0.v[lVar18];
            lVar1 = uVar17 + lVar18;
            lVar18 = lVar18 + 1;
          } while (lVar1 + 1U < (ulong)uVar12);
        }
      }
      if (pfVar8 != (float *)0x0) {
        uVar12 = uVar16 + 4;
        if (uVar2 <= uVar16 + 4) {
          uVar12 = uVar2;
        }
        if (uVar16 < uVar12) {
          lVar18 = 0;
          do {
            pfVar8[uVar17 + lVar18] = ddPdudut.field_0.v[lVar18];
            pfVar9[uVar17 + lVar18] = ddPdvdvt.field_0.v[lVar18];
            pfVar10[uVar17 + lVar18] = ddPdudvt.field_0.v[lVar18];
            lVar1 = uVar17 + lVar18;
            lVar18 = lVar18 + 1;
          } while (lVar1 + 1U < (ulong)uVar12);
        }
      }
      uVar16 = uVar16 + 4;
    } while (uVar16 < uVar2);
  }
  return;
}

Assistant:

void SubdivMeshISA::interpolate(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      float v = args->v;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < RTC_MAX_TIME_STEP_COUNT) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot < RTC_MAX_USER_VERTEX_BUFFERS));
      const char* src = nullptr; 
      size_t stride = 0;
      std::vector<SharedLazyTessellationCache::CacheEntry>* baseEntry = nullptr;
      Topology* topo = nullptr;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        assert(bufferSlot < vertexAttribs.size());
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
        baseEntry = &vertex_attrib_buffer_tags[bufferSlot];
        int topologyID = vertexAttribs[bufferSlot].userData;
        topo = &topology[topologyID];
      } else {
        assert(bufferSlot < numTimeSteps);
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
        baseEntry = &vertex_buffer_tags[bufferSlot];
        topo = &topology[0];
      }
      
      bool has_P = P;
      bool has_dP = dPdu;     assert(!has_dP  || dPdv);
      bool has_ddP = ddPdudu; assert(!has_ddP || (ddPdvdv && ddPdudu));
      
      for (unsigned int i=0; i<valueCount; i+=4)
      {
        vfloat4 Pt, dPdut, dPdvt, ddPdudut, ddPdvdvt, ddPdudvt;
        isa::PatchEval<vfloat4,vfloat4>(baseEntry->at(interpolationSlot(primID,i/4,stride)),commitCounter,
                                        topo->getHalfEdge(primID),src+i*sizeof(float),stride,u,v,
                                        has_P ? &Pt : nullptr, 
                                        has_dP ? &dPdut : nullptr, 
                                        has_dP ? &dPdvt : nullptr,
                                        has_ddP ? &ddPdudut : nullptr, 
                                        has_ddP ? &ddPdvdvt : nullptr, 
                                        has_ddP ? &ddPdudvt : nullptr);
        
        if (has_P) {
          for (size_t j=i; j<min(i+4,valueCount); j++) 
            P[j] = Pt[j-i];
        }
        if (has_dP) 
        {
          for (size_t j=i; j<min(i+4,valueCount); j++) {
            dPdu[j] = dPdut[j-i];
            dPdv[j] = dPdvt[j-i];
          }
        }
        if (has_ddP) 
        {
          for (size_t j=i; j<min(i+4,valueCount); j++) {
            ddPdudu[j] = ddPdudut[j-i];
            ddPdvdv[j] = ddPdvdvt[j-i];
            ddPdudv[j] = ddPdudvt[j-i];
          }
        }
      }
    }